

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O2

internals ** __thiscall pybind11::capsule::get_pointer<pybind11::detail::internals*>(capsule *this)

{
  char *pcVar1;
  internals **ppiVar2;
  
  pcVar1 = name(this);
  ppiVar2 = (internals **)PyCapsule_GetPointer((this->super_object).super_handle.m_ptr,pcVar1);
  if (ppiVar2 != (internals **)0x0) {
    return ppiVar2;
  }
  PyErr_Clear();
  pybind11_fail("Unable to extract capsule contents!");
}

Assistant:

T* get_pointer() const {
        auto name = this->name();
        T *result = static_cast<T *>(PyCapsule_GetPointer(m_ptr, name));
        if (!result) {
            PyErr_Clear();
            pybind11_fail("Unable to extract capsule contents!");
        }
        return result;
    }